

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.h
# Opt level: O1

int __thiscall CCommandManager::RemoveCommand(CCommandManager *this,char *pCommand)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  
  iVar1 = (this->m_aCommands).num_elements;
  bVar3 = iVar1 < 1;
  if (0 < iVar1) {
    iVar1 = str_comp(((this->m_aCommands).list)->m_aName,pCommand);
    if (iVar1 == 0) {
      lVar5 = 0;
    }
    else {
      lVar4 = 0xa0;
      lVar5 = 0;
      do {
        lVar5 = lVar5 + 1;
        lVar2 = (long)(this->m_aCommands).num_elements;
        bVar3 = lVar2 <= lVar5;
        if (lVar2 <= lVar5) goto LAB_0013b84e;
        iVar1 = str_comp(((this->m_aCommands).list)->m_aName + lVar4,pCommand);
        lVar4 = lVar4 + 0xa0;
      } while (iVar1 != 0);
    }
    if (this->m_pfnRemoveCommandHook != (FRemoveCommandHook)0x0) {
      (*this->m_pfnRemoveCommandHook)((this->m_aCommands).list + lVar5,this->m_pHookContext);
    }
    array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_>::remove_index
              (&this->m_aCommands,(int)lVar5);
  }
LAB_0013b84e:
  return (int)bVar3;
}

Assistant:

int RemoveCommand(const char *pCommand)
    {
        for(int i = 0; i < m_aCommands.size(); i++)
        {
            if(!str_comp(m_aCommands[i].m_aName, pCommand))
            {
                if(m_pfnRemoveCommandHook)
                    m_pfnRemoveCommandHook(&m_aCommands[i], m_pHookContext);

                m_aCommands.remove_index(i);
                return 0;
            }
        }

        return 1;
    }